

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

UA_StatusCode UA_EndpointUrl_split_ptr(char *endpointUrl,char *hostname,char **port,char **path)

{
  int iVar1;
  size_t sVar2;
  bool bVar3;
  ulong local_58;
  ulong local_50;
  size_t pathpos;
  ulong uStack_40;
  UA_Boolean ip6_end_found;
  size_t portpos;
  size_t urlLength;
  char **path_local;
  char **port_local;
  char *hostname_local;
  char *endpointUrl_local;
  
  if ((endpointUrl == (char *)0x0) || (hostname == (char *)0x0)) {
    endpointUrl_local._4_4_ = 0x80ab0000;
  }
  else {
    sVar2 = strlen(endpointUrl);
    if ((sVar2 < 10) || (0xff < sVar2)) {
      endpointUrl_local._4_4_ = 0x803c0000;
    }
    else {
      iVar1 = strncmp(endpointUrl,"opc.tcp://",10);
      if (iVar1 == 0) {
        path_local = port;
        if (sVar2 == 10) {
          *hostname = '\0';
          path_local = (char **)0x0;
          *path = (char *)0x0;
        }
        uStack_40 = 10;
        bVar3 = endpointUrl[10] != '[';
        for (; uStack_40 < sVar2; uStack_40 = uStack_40 + 1) {
          if (bVar3) {
            if ((endpointUrl[uStack_40] == ':') || (endpointUrl[uStack_40] == '/')) break;
          }
          else if (endpointUrl[uStack_40] == ']') {
            bVar3 = true;
          }
        }
        memcpy(hostname,endpointUrl + 10,uStack_40 - 10);
        hostname[uStack_40 - 10] = '\0';
        if (path_local != (char **)0x0) {
          if (uStack_40 < sVar2 - 1) {
            if (endpointUrl[uStack_40] == '/') {
              *path_local = (char *)0x0;
            }
            else {
              *path_local = endpointUrl + uStack_40 + 1;
            }
          }
          else {
            *path_local = (char *)0x0;
          }
        }
        if (path != (char **)0x0) {
          if (uStack_40 < sVar2) {
            local_58 = uStack_40;
          }
          else {
            local_58 = 10;
          }
          for (local_50 = local_58; (local_50 < sVar2 && (endpointUrl[local_50] != '/'));
              local_50 = local_50 + 1) {
          }
          if (local_50 < sVar2 - 1) {
            *path = endpointUrl + local_50 + 1;
          }
          else {
            *path = (char *)0x0;
          }
        }
        endpointUrl_local._4_4_ = 0;
      }
      else {
        endpointUrl_local._4_4_ = 0x80350000;
      }
    }
  }
  return endpointUrl_local._4_4_;
}

Assistant:

UA_StatusCode
UA_EndpointUrl_split_ptr(const char *endpointUrl, char *hostname,
                         const char ** port, const char **path) {
    if (!endpointUrl || !hostname)
        return UA_STATUSCODE_BADINVALIDARGUMENT;

    size_t urlLength = strlen(endpointUrl);
    if(urlLength < 10 || urlLength >= 256)
        return UA_STATUSCODE_BADOUTOFRANGE;

    if(strncmp(endpointUrl, "opc.tcp://", 10) != 0)
        return UA_STATUSCODE_BADATTRIBUTEIDINVALID;

    if (urlLength == 10) {
        hostname[0] = '\0';
        port = NULL;
        *path = NULL;
    }

    /* where does the port begin? */
    size_t portpos = 10;
    // opc.tcp://[2001:0db8:85a3::8a2e:0370:7334]:1234/path
    // if ip6, then end not found, otherwise we are fine
    UA_Boolean ip6_end_found = endpointUrl[portpos] != '[';
    for(; portpos < urlLength; ++portpos) {
        if (!ip6_end_found) {
            if (endpointUrl[portpos] == ']')
                ip6_end_found = UA_TRUE;
            continue;
        }

        if(endpointUrl[portpos] == ':' || endpointUrl[portpos] == '/')
            break;
    }

    memcpy(hostname, &endpointUrl[10], portpos - 10);
    hostname[portpos-10] = 0;

    if(port) {
        if (portpos < urlLength - 1) {
            if (endpointUrl[portpos] == '/')
                *port = NULL;
            else
                *port = &endpointUrl[portpos + 1];
        } else {
            *port = NULL;
        }
    }

    if(path) {
        size_t pathpos = portpos < urlLength ? portpos : 10;
        for(; pathpos < urlLength; ++pathpos) {
            if(endpointUrl[pathpos] == '/')
                break;
        }
        if (pathpos < urlLength-1)
            *path = &endpointUrl[pathpos+1]; // do not include slash in path
        else
            *path = NULL;
    }

    return UA_STATUSCODE_GOOD;
}